

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::CreateTextureARGB8_3DGS_MDL3(MDLImporter *this,uchar *szData)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  aiScene *paVar5;
  aiTexture **ppaVar6;
  long lVar7;
  uint i;
  uchar *in_RAX;
  aiTexture *paVar8;
  aiTexel *paVar9;
  ulong uVar10;
  aiTexture **ppaVar11;
  ulong uVar12;
  MDLImporter *this_00;
  uchar *szColorMap;
  
  puVar4 = this->mBuffer;
  szColorMap = in_RAX;
  SizeCheck(this,szData + (long)*(int *)(puVar4 + 0x38) * (long)*(int *)(puVar4 + 0x34),
            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x8c);
  paVar8 = (aiTexture *)operator_new(0x428);
  paVar8->pcData = (aiTexel *)0x0;
  (paVar8->mFilename).length = 0;
  (paVar8->mFilename).data[0] = '\0';
  memset((paVar8->mFilename).data + 1,0x1b,0x3ff);
  paVar8->achFormatHint[0] = '\0';
  paVar8->achFormatHint[1] = '\0';
  paVar8->achFormatHint[2] = '\0';
  paVar8->achFormatHint[3] = '\0';
  uVar2 = *(uint *)(puVar4 + 0x34);
  paVar8->mWidth = uVar2;
  uVar3 = *(uint *)(puVar4 + 0x38);
  paVar8->mHeight = uVar3;
  uVar12 = (ulong)(uVar3 * uVar2);
  paVar9 = (aiTexel *)operator_new__(uVar12 * 4);
  paVar8->pcData = paVar9;
  this_00 = this;
  SearchPalette(this,&szColorMap);
  for (uVar10 = 0; uVar10 < uVar12; uVar10 = uVar10 + 1) {
    lVar7 = (ulong)szData[uVar10] * 3;
    paVar9[uVar10].a = 0xff;
    paVar9[uVar10].r = szColorMap[lVar7];
    paVar9[uVar10].g = szColorMap[lVar7 + 1];
    paVar9[uVar10].b = szColorMap[lVar7 + 2];
  }
  FreePalette(this_00,szColorMap);
  paVar5 = this->pScene;
  ppaVar6 = paVar5->mTextures;
  ppaVar11 = (aiTexture **)operator_new__((ulong)(paVar5->mNumTextures + 1) << 3);
  paVar5->mTextures = ppaVar11;
  uVar10 = 0;
  while( true ) {
    paVar5 = this->pScene;
    if (paVar5->mNumTextures <= uVar10) break;
    paVar5->mTextures[uVar10] = ppaVar6[uVar10];
    uVar10 = uVar10 + 1;
  }
  paVar5->mTextures[paVar5->mNumTextures] = paVar8;
  puVar1 = &this->pScene->mNumTextures;
  *puVar1 = *puVar1 + 1;
  if (ppaVar6 != (aiTexture **)0x0) {
    operator_delete__(ppaVar6);
    return;
  }
  return;
}

Assistant:

void MDLImporter::CreateTextureARGB8_3DGS_MDL3(const unsigned char* szData)
{
    const MDL::Header *pcHeader = (const MDL::Header*)mBuffer;  //the endianness is already corrected in the InternReadFile_3DGS_MDL345 function

    VALIDATE_FILE_SIZE(szData + pcHeader->skinwidth *
        pcHeader->skinheight);

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();
    pcNew->mWidth = pcHeader->skinwidth;
    pcNew->mHeight = pcHeader->skinheight;

    pcNew->pcData = new aiTexel[pcNew->mWidth * pcNew->mHeight];

    const unsigned char* szColorMap;
    this->SearchPalette(&szColorMap);

    // copy texture data
    for (unsigned int i = 0; i < pcNew->mWidth*pcNew->mHeight;++i)
    {
        const unsigned char val = szData[i];
        const unsigned char* sz = &szColorMap[val*3];

        pcNew->pcData[i].a = 0xFF;
        pcNew->pcData[i].r = *sz++;
        pcNew->pcData[i].g = *sz++;
        pcNew->pcData[i].b = *sz;
    }

    FreePalette(szColorMap);

    // store the texture
    aiTexture** pc = this->pScene->mTextures;
    this->pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
    for (unsigned int i = 0; i <pScene->mNumTextures;++i)
        pScene->mTextures[i] = pc[i];

    pScene->mTextures[this->pScene->mNumTextures] = pcNew;
    pScene->mNumTextures++;
    delete[] pc;
    return;
}